

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O1

float __thiscall Randomizer::randSpawnRnd(Randomizer *this)

{
  float fVar1;
  uniform_real_distribution<float> *puVar2;
  float fVar3;
  
  puVar2 = this->RespawnRnd;
  fVar3 = std::
          generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (this->RndCore);
  fVar1 = (puVar2->_M_param)._M_a;
  return fVar3 * ((puVar2->_M_param)._M_b - fVar1) + fVar1;
}

Assistant:

float Randomizer::randSpawnRnd()
{
    return (*RespawnRnd)(*RndCore);
}